

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdPrint2_rec(FILE *pFile,Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  int iVar3;
  Kit_DsdObj_t *pKVar4;
  uint uVar5;
  int __c;
  ulong uVar6;
  int iStack_40;
  
  pKVar4 = Kit_DsdNtkObj(pNtk,Id);
  if (pKVar4 == (Kit_DsdObj_t *)0x0) {
    if ((int)(uint)pNtk->nVars <= Id) {
      __assert_fail("Id < pNtk->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0xf7,"void Kit_DsdPrint2_rec(FILE *, Kit_DsdNtk_t *, int)");
    }
    iStack_40 = Id + 0x61;
  }
  else {
    KVar2 = *pKVar4;
    uVar5 = (uint)KVar2 >> 6 & 7;
    if (uVar5 == 2) {
      if (((uint)KVar2 & 0xfc000000) != 0x4000000) {
        __assert_fail("pObj->nFans == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                      ,0x104,"void Kit_DsdPrint2_rec(FILE *, Kit_DsdNtk_t *, int)");
      }
    }
    else if (uVar5 == 1) {
      if (0x3ffffff < (uint)KVar2) {
        __assert_fail("pObj->nFans == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                      ,0xfe,"void Kit_DsdPrint2_rec(FILE *, Kit_DsdNtk_t *, int)");
      }
      fwrite("Const1",6,1,(FILE *)pFile);
      return;
    }
    __c = 0x2a;
    if (uVar5 != 3) {
      __c = (uVar5 != 4) + 0x2b;
    }
    iVar3 = 0x28;
    if (((uint)KVar2 & 0x1c0) == 0x140) {
      iVar3 = 0x5b;
    }
    fputc(iVar3,(FILE *)pFile);
    for (uVar6 = 0; uVar6 < (uint)*pKVar4 >> 0x1a; uVar6 = uVar6 + 1) {
      uVar1 = *(ushort *)(&pKVar4[1].field_0x0 + uVar6 * 2);
      iVar3 = Abc_LitIsCompl((uint)uVar1);
      if (iVar3 != 0) {
        fputc(0x21,(FILE *)pFile);
      }
      iVar3 = Abc_Lit2Var((uint)uVar1);
      Kit_DsdPrint2_rec(pFile,pNtk,iVar3);
      if (uVar6 < ((uint)*pKVar4 >> 0x1a) - 1) {
        fputc(__c,(FILE *)pFile);
      }
    }
    if (((uint)*pKVar4 & 0x1c0) == 0x140) {
      iStack_40 = 0x5d;
    }
    else {
      iStack_40 = 0x29;
    }
  }
  fputc(iStack_40,(FILE *)pFile);
  return;
}

Assistant:

void Kit_DsdPrint2_rec( FILE * pFile, Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i;
    char Symbol;

    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        fprintf( pFile, "%c", 'a' + Id );
        return;
    }

    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        fprintf( pFile, "Const1" );
        return;
    }

    if ( pObj->Type == KIT_DSD_VAR )
        assert( pObj->nFans == 1 );

    if ( pObj->Type == KIT_DSD_AND )
        Symbol = '*';
    else if ( pObj->Type == KIT_DSD_XOR )
        Symbol = '+';
    else 
        Symbol = ',';

    if ( pObj->Type == KIT_DSD_PRIME )
        fprintf( pFile, "[" );
    else
        fprintf( pFile, "(" );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
    {
        if ( Abc_LitIsCompl(iLit) ) 
            fprintf( pFile, "!" );
        Kit_DsdPrint2_rec( pFile, pNtk, Abc_Lit2Var(iLit) );
        if ( i < pObj->nFans - 1 )
            fprintf( pFile, "%c", Symbol );
    }
    if ( pObj->Type == KIT_DSD_PRIME )
        fprintf( pFile, "]" );
    else
        fprintf( pFile, ")" );
}